

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

wstring * __thiscall
(anonymous_namespace)::t_debugger::f_read_string_abi_cxx11_
          (wstring *__return_storage_ptr__,void *this,wint_t *a_c,wchar_t a_terminator)

{
  wchar_t __c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  __c = *this;
  if (__c != (wchar_t)a_c && __c != L'\xffffffff') {
    do {
      std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
      push_back(__return_storage_ptr__,__c);
      __c = getwchar();
      *(wchar_t *)this = __c;
      if (__c == L'\xffffffff') {
        return __return_storage_ptr__;
      }
    } while (__c != (wchar_t)a_c);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring f_read_string(wint_t& a_c, wchar_t a_terminator)
	{
		std::wstring s;
		while (a_c != WEOF && a_c != a_terminator) {
			s.push_back(a_c);
			a_c = std::getwchar();
		}
		return s;
	}